

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::RegAlloc(LinearScan *this)

{
  Type *ppAVar1;
  undefined1 *puVar2;
  IRKind IVar3;
  uint uVar4;
  ScriptContextInfo *pSVar5;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint32 uVar11;
  uint uVar12;
  uint uVar13;
  BOOL BVar14;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar15;
  BVSparse<Memory::JitArenaAllocator> *pBVar16;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *pSVar17;
  LoweredBasicBlock *pLVar18;
  GlobalBailOutRecordDataTable **ppGVar19;
  uint **ppuVar20;
  undefined4 *puVar21;
  LabelInstr *pLVar22;
  Instr *pIVar23;
  BailOutInfo *pBVar24;
  BranchInstr *branchInstr;
  GeneratorBailInInstr *bailInInstr;
  Instr *pIVar25;
  Func *pFVar26;
  uint uVar27;
  Type pAVar28;
  uint i;
  Instr *this_00;
  undefined1 local_160 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  SCCLiveness liveness;
  undefined1 local_50 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)local_160,L"BE-LinearScan",
             (this->func->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
  this->tempAlloc = (JitArenaAllocator *)local_160;
  pSVar15 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3d6ef4);
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar15;
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar15->allocator = (Type)local_160;
  this->opHelperSpilledLiveranges = pSVar15;
  pSVar15 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3d6ef4);
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar15;
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar15->allocator = (Type)local_160;
  this->activeLiveranges = pSVar15;
  pBVar16 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,(JitArenaAllocator *)local_160,0x3d6ef4);
  pBVar16->head = (Type_conflict)0x0;
  pBVar16->lastFoundIndex = (Type_conflict)0x0;
  pBVar16->alloc = (JitArenaAllocator *)local_160;
  pBVar16->lastUsedNodePrevNextField = (Type)pBVar16;
  this->liveOnBackEdgeSyms = pBVar16;
  pSVar15 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3d6ef4);
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar15;
  (pSVar15->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar15->allocator = (Type)local_160;
  this->stackPackInUseLiveRanges = pSVar15;
  pSVar17 = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,(JitArenaAllocator *)local_160,0x3d6ef4);
  (pSVar17->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar17;
  (pSVar17->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
       0;
  pSVar17->allocator = (Type)local_160;
  this->stackSlotsFreeList = pSVar17;
  pLVar18 = LoweredBasicBlock::New((JitArenaAllocator *)local_160);
  this->currentBlock = pLVar18;
  pIVar25 = this->func->m_headInstr;
  SCCLiveness::SCCLiveness
            ((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList,this->func,this->tempAlloc
            );
  local_50 = (undefined1  [8])this->func;
  __autoCodeGen.func._0_4_ = 0xe6;
  Func::BeginPhase((Func *)local_50,LivenessPhase);
  SCCLiveness::Build((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_50,this->func,LivenessPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_50);
  this->lifetimeList =
       (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&liveness.extendedLifetimesLoopList;
  ppAVar1 = &liveness.lifetimeList.allocator;
  this->opHelperBlockList = (SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  (this->opHelperBlockIter).list =
       (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)ppAVar1;
  pAVar28 = (Type)0x0;
  if (liveness.lifetimeList.allocator != (Type)ppAVar1) {
    pAVar28 = liveness.lifetimeList.allocator;
  }
  (this->opHelperBlockIter).current = (NodeBase *)pAVar28;
  Init(this);
  pFVar26 = this->func;
  __autoCodeGen._8_8_ = &pFVar26->topFunc->nativeCodeDataAllocator;
  if ((pFVar26->field_0x240 & 0x10) != 0) {
    ppGVar19 = Memory::
               AllocateArray<NativeCodeData::AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable*>>,GlobalBailOutRecordDataTable*,false>
                         ((Memory *)__autoCodeGen._8_8_,
                          (AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_> *)
                          NativeCodeData::
                          AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>::
                          AllocZero,0,(ulong)(pFVar26->m_inlineeId + 1));
    this->globalBailOutRecordTables = ppGVar19;
    ppuVar20 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                         ((Memory *)this->tempAlloc,
                          (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,
                          (ulong)(this->func->m_inlineeId + 1));
    this->lastUpdatedRowIndices = ppuVar20;
    if (DAT_0144d963 == '\x01') {
      pSVar5 = this->func->m_scriptContextInfo;
      uVar27 = this->func->m_inlineeId + 1;
      pSVar5[0x11f]._vptr_ScriptContextInfo = pSVar5[0x11f]._vptr_ScriptContextInfo + uVar27;
      pSVar5[0x120]._vptr_ScriptContextInfo = pSVar5[0x120]._vptr_ScriptContextInfo + uVar27;
    }
  }
  this->m_bailOutRecordCount = 0;
  puVar21 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  bVar9 = true;
  liveness._112_8_ = &DAT_01453738;
  while (this_00 = pIVar25, this_00 != (Instr *)0x0) {
    pIVar25 = this_00->m_next;
    uVar11 = IR::Instr::GetNumber(this_00);
    if (uVar11 == 0) {
      bVar8 = LowererMD::IsAssign(this_00);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar21 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x9b,"(LowererMD::IsAssign(instr))","Only expect spill code here");
        if (!bVar8) goto LAB_0052cb79;
        *puVar21 = 0;
      }
    }
    else {
      uVar12 = Func::GetSourceContextId(this->func);
      uVar13 = Func::GetLocalFunctionId(this->func);
      bVar8 = Js::Phases::IsEnabled((Phases *)liveness._112_8_,LinearScanPhase,uVar12,uVar13);
      if (bVar8) {
        IR::Instr::Dump(this_00);
      }
      this->currentInstr = this_00;
      IVar3 = this_00->m_kind;
      if (((IVar3 < 7) && ((0x68U >> (IVar3 & 0x1f) & 1) != 0)) || (bVar9 != false)) {
        this->currentBlockNumber = this->currentBlockNumber + 1;
      }
      if (IVar3 == InstrKindBranch) {
        BVar14 = Func::HasTry(this->func);
        if ((BVar14 != 0) && (bVar9 = Func::DoOptimizeTry(this->func), bVar9)) {
          ProcessEHRegionBoundary(this,this_00);
        }
        if (this->loopNest == 0) goto LAB_0052c6b8;
        uVar11 = IR::Instr::GetNumber(this_00);
        bVar8 = (this->curLoop->regAlloc).loopEnd <= uVar11;
      }
      else {
        if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) {
          pLVar22 = IR::Instr::AsLabelInstr(this_00);
          this->lastLabel = pLVar22;
          if (pLVar22->m_loweredBasicBlock == (LoweredBasicBlock *)0x0) {
            if ((0 < (this->currentBlock->inlineeFrameLifetimes).
                     super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                     count) ||
               (0 < (this->currentBlock->inlineeStack).
                    super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count)) {
              pIVar23 = IR::Instr::GetPrevRealInstrOrLabel(this_00);
              if (pIVar23 == (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar21 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0xbf,"(prevInstr)","prevInstr");
                if (!bVar9) goto LAB_0052cb79;
                *puVar21 = 0;
              }
              bVar9 = IR::Instr::HasFallThrough(pIVar23);
              if (!bVar9) {
                pLVar18 = LoweredBasicBlock::New((JitArenaAllocator *)local_160);
                goto LAB_0052c5c9;
              }
            }
          }
          else {
            pIVar23 = IR::Instr::GetPrevRealInstrOrLabel(this_00);
            if (pIVar23 == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar21 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0xb4,"(prevInstr)","prevInstr");
              if (!bVar9) goto LAB_0052cb79;
              *puVar21 = 0;
            }
            bVar9 = IR::Instr::HasFallThrough(pIVar23);
            if (bVar9) {
              Memory::
              DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,LoweredBasicBlock>
                        ((AllocatorType *)local_160,this->currentBlock);
            }
            pLVar18 = this->lastLabel->m_loweredBasicBlock;
LAB_0052c5c9:
            this->currentBlock = pLVar18;
          }
          this->currentRegion = this->lastLabel->m_region;
        }
LAB_0052c6b8:
        bVar8 = false;
      }
      bVar10 = RemoveDeadStores(this,this_00);
      bVar9 = false;
      if (!bVar10) {
        if (((this_00->field_0x38 & 0x10) != 0) &&
           (pBVar24 = IR::Instr::GetBailOutInfo(this_00),
           pBVar24->bailOutRecord == (BailOutRecord *)0x0)) {
          pIVar23 = this_00;
          if (DAT_0143bfa9 == '\x01') {
            for (; pIVar23->globOptInstrString == (char16 *)0x0; pIVar23 = pIVar23->m_prev) {
            }
            IR::Instr::Dump(this_00);
            IR::Instr::DumpGlobOptInstrString(pIVar23);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar21 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xeb,"(false)","Lazy bailout: bailOutRecord not allocated");
          if (!bVar9) goto LAB_0052cb79;
          *puVar21 = 0;
        }
        if (((this_00->field_0x38 & 0x10) != 0) &&
           (bVar9 = IR::Instr::HasLazyBailOut(this_00), !bVar9)) {
          if ((this->currentRegion != (Region *)0x0) &&
             ((byte)(this->currentRegion->type - RegionTypeTry) < 3)) {
            puVar2 = &this->func->field_0x240;
            *(uint *)puVar2 = *(uint *)puVar2 | 0x20;
          }
          FillBailOutRecord(this,this_00);
        }
        SetSrcRegs(this,this_00);
        EndDeadLifetimes(this,this_00,bVar8);
        if (this_00->m_kind == InstrKindBranch) {
          branchInstr = IR::Instr::AsBranchInstr(this_00);
          ProcessSecondChanceBoundary(this,branchInstr);
        }
        CheckIfInLoop(this,this_00);
        if (bVar8 != false) {
          EndDeadLifetimes(this,this_00,false);
        }
        CheckOpHelper(this,this_00);
        KillImplicitRegs(this,this_00);
        ProcessLazyBailOut(this,this_00);
        AllocateNewLifetimes(this,this_00);
        SetDstReg(this,this_00);
        EndDeadOpHelperLifetimes(this,this_00);
        if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
          pLVar22 = IR::Instr::AsLabelInstr(this_00);
          ProcessSecondChanceBoundary(this,pLVar22);
        }
        CheckInvariants(this);
        bVar9 = IR::Instr::EndsBasicBlock(this_00);
        if (this_00->m_opcode == GeneratorBailInLabel) {
          bailInInstr = IR::Instr::AsGeneratorBailInInstr(this_00);
          pIVar25 = GeneratorBailIn::GenerateBailIn(&this->bailIn,bailInInstr);
        }
      }
    }
  }
  pFVar26 = this->func;
  if ((pFVar26->field_0x240 & 0x10) != 0) {
    for (uVar27 = 0; uVar27 <= pFVar26->m_inlineeId; uVar27 = uVar27 + 1) {
      if (this->globalBailOutRecordTables[uVar27] != (GlobalBailOutRecordDataTable *)0x0) {
        GlobalBailOutRecordDataTable::Finalize
                  (this->globalBailOutRecordTables[uVar27],(Allocator *)__autoCodeGen._8_8_,
                   (JitArenaAllocator *)local_160);
        pFVar26 = this->func;
        if (DAT_0144d963 == '\x01') {
          pSVar5 = pFVar26->m_scriptContextInfo;
          uVar4 = this->globalBailOutRecordTables[uVar27]->length;
          pSVar5[0x11f]._vptr_ScriptContextInfo =
               pSVar5[0x11f]._vptr_ScriptContextInfo + (ulong)uVar4 * 2;
          pSVar5[0x120]._vptr_ScriptContextInfo =
               pSVar5[0x120]._vptr_ScriptContextInfo + (ulong)uVar4 * 2;
        }
      }
    }
  }
  if (this->floatRegUsedCount + this->intRegUsedCount != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar21 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13b,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func))"
                       ,"RegUsedCount is wrong");
    if (!bVar9) goto LAB_0052cb79;
    *puVar21 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->activeLiveranges->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->activeLiveranges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar21 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13c,"(this->activeLiveranges->Empty())","Active list not empty");
    if (!bVar9) goto LAB_0052cb79;
    *puVar21 = 0;
  }
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->stackPackInUseLiveRanges->
      super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this->stackPackInUseLiveRanges) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar21 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13d,"(this->stackPackInUseLiveRanges->Empty())","Spilled list not empty");
    if (!bVar9) goto LAB_0052cb79;
    *puVar21 = 0;
  }
  pSVar6 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
           (this->opHelperBlockIter).current;
  if ((pSVar6 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar6 != (this->opHelperBlockIter).list)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar21 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13f,"(!this->opHelperBlockIter.IsValid())",
                       "Got to the end with a helper block still on the list?");
    if (!bVar9) goto LAB_0052cb79;
    *puVar21 = 0;
  }
  if ((this->currentBlock->inlineeStack).
      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar21 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x141,"(this->currentBlock->inlineeStack.Count() == 0)",
                       "this->currentBlock->inlineeStack.Count() == 0");
    if (!bVar9) {
LAB_0052cb79:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar21 = 0;
  }
  InsertOpHelperSpillAndRestores(this);
  uVar12 = Func::GetSourceContextId(this->func);
  uVar13 = Func::GetLocalFunctionId(this->func);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01450888,LinearScanPhase,uVar12,uVar13);
  if (bVar9) {
    PrintStats(this);
  }
  uVar12 = Func::GetSourceContextId(this->func);
  uVar13 = Func::GetLocalFunctionId(this->func);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,StackPackPhase,uVar12,uVar13);
  if (bVar9) {
    Output::Print(L"---------------------------\n");
  }
  this->func->allowRemoveBailOutArgInstr = true;
  SCCLiveness::~SCCLiveness((SCCLiveness *)&tempAlloc.super_JitArenaAllocator.bvFreeList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_160);
  return;
}

Assistant:

void
LinearScan::RegAlloc()
{
    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LinearScan"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->tempAlloc = &tempAlloc;
    this->opHelperSpilledLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->activeLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->liveOnBackEdgeSyms = JitAnew(&tempAlloc, BVSparse<JitArenaAllocator>, &tempAlloc);
    this->stackPackInUseLiveRanges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->stackSlotsFreeList = JitAnew(&tempAlloc, SList<StackSlot *>, &tempAlloc);
    this->currentBlock = LoweredBasicBlock::New(&tempAlloc);

    IR::Instr *currentInstr = this->func->m_headInstr;

    SCCLiveness liveness(this->func, this->tempAlloc);
    BEGIN_CODEGEN_PHASE(this->func, Js::LivenessPhase);

    // Build the lifetime list
    liveness.Build();
    END_CODEGEN_PHASE(this->func, Js::LivenessPhase);


    this->lifetimeList = &liveness.lifetimeList;

    this->opHelperBlockList = &liveness.opHelperBlockList;
    this->opHelperBlockIter = SList<OpHelperBlock>::Iterator(this->opHelperBlockList);
    this->opHelperBlockIter.Next();

    this->Init();

    NativeCodeData::Allocator * nativeAllocator = this->func->GetNativeCodeDataAllocator();
    if (func->hasBailout)
    {
        this->globalBailOutRecordTables = NativeCodeDataNewArrayZ(nativeAllocator, GlobalBailOutRecordDataTable *,  func->m_inlineeId + 1);
        this->lastUpdatedRowIndices = JitAnewArrayZ(this->tempAlloc, uint *, func->m_inlineeId + 1);

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            this->func->GetScriptContext()->bailOutOffsetBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
            this->func->GetScriptContext()->bailOutRecordBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
        }
#endif
    }

    m_bailOutRecordCount = 0;
    bool endOfBasicBlock = true;
    FOREACH_INSTR_EDITING(instr, instrNext, currentInstr)
    {
        if (instr->GetNumber() == 0)
        {
            AssertMsg(LowererMD::IsAssign(instr), "Only expect spill code here");
            continue;
        }

#if DBG_DUMP && defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            instr->Dump();
        }
#endif // DBG

        this->currentInstr = instr;
        if (instr->StartsBasicBlock() || endOfBasicBlock)
        {
            endOfBasicBlock = false;
            ++currentBlockNumber;
        }

        bool isLoopBackEdge = false;
        if (instr->IsLabelInstr())
        {
            this->lastLabel = instr->AsLabelInstr();
            if (this->lastLabel->m_loweredBasicBlock)
            {
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (prevInstr->HasFallThrough())
                {
                    this->currentBlock->Delete(&tempAlloc);
                }
                this->currentBlock = this->lastLabel->m_loweredBasicBlock;
            }
            else if (currentBlock->HasData())
            {
                // Check if the previous block has fall-through. If so, retain the block info. If not, create empty info.
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (!prevInstr->HasFallThrough())
                {
                    currentBlock = LoweredBasicBlock::New(&tempAlloc);
                }
            }
            this->currentRegion = this->lastLabel->GetRegion();
        }
        else if (instr->IsBranchInstr())
        {
            if (this->func->HasTry() && this->func->DoOptimizeTry())
            {
                this->ProcessEHRegionBoundary(instr);
            }

            isLoopBackEdge = this->IsInLoop() && instr->GetNumber() >= this->curLoop->regAlloc.loopEnd;
        }

        if (this->RemoveDeadStores(instr))
        {
            continue;
        }

#if DBG
        // Since not all call instructions are forwarded to ChangeToHelperCall, we might have
        // missed allocating bailout records for them. Additionally, some instructions might
        // end up being lowered differently, so the lazy bailout is not on a CALL instruction
        // anymore. Use this opportunity to detect them.
        // Note that the dump for the instruction will also be printed with -ForcePostLowerGlobOptInstrString
        if (instr->HasBailOutInfo() && instr->GetBailOutInfo()->bailOutRecord == nullptr)
        {
            if (CONFIG_FLAG(ForcePostLowerGlobOptInstrString))
            {
                // The instruction has already been lowered, find the start to get the globopt dump
                IR::Instr *curr = instr;
                while (curr->globOptInstrString == nullptr)
                {
                    curr = curr->m_prev;
                }

                instr->Dump();
                curr->DumpGlobOptInstrString();
            }

            AssertMsg(false, "Lazy bailout: bailOutRecord not allocated");
        }
#endif

        if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
        {
            if (this->currentRegion)
            {
                RegionType curRegType = this->currentRegion->GetType();
                if (curRegType == RegionTypeTry || curRegType == RegionTypeCatch || curRegType == RegionTypeFinally)
                {
                    this->func->hasBailoutInEHRegion = true;
                }
            }

            this->FillBailOutRecord(instr);
        }

        this->SetSrcRegs(instr);
        this->EndDeadLifetimes(instr, isLoopBackEdge);

        if (instr->IsBranchInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsBranchInstr());
        }
        this->CheckIfInLoop(instr);
        if (isLoopBackEdge)
        {
            this->EndDeadLifetimes(instr, false);
        }

        this->CheckOpHelper(instr);

        this->KillImplicitRegs(instr);

        this->ProcessLazyBailOut(instr);

        this->AllocateNewLifetimes(instr);
        this->SetDstReg(instr);

        this->EndDeadOpHelperLifetimes(instr);

        if (instr->IsLabelInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsLabelInstr());
        }

#if DBG
        this->CheckInvariants();
#endif // DBG

        if(instr->EndsBasicBlock())
        {
            endOfBasicBlock = true;
        }

        if (instr->IsGeneratorBailInInstr())
        {
            instrNext = this->bailIn.GenerateBailIn(instr->AsGeneratorBailInInstr());
        }
    } NEXT_INSTR_EDITING;

    if (func->hasBailout)
    {
        for (uint i = 0; i <= func->m_inlineeId; i++)
        {
            if (globalBailOutRecordTables[i] != nullptr)
            {
                globalBailOutRecordTables[i]->Finalize(nativeAllocator, &tempAlloc);
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
                if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
                {
                    func->GetScriptContext()->bailOutOffsetBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                    func->GetScriptContext()->bailOutRecordBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                }
#endif
            }
        }
    }

    AssertMsg((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func) , "RegUsedCount is wrong");
    AssertMsg(this->activeLiveranges->Empty(), "Active list not empty");
    AssertMsg(this->stackPackInUseLiveRanges->Empty(), "Spilled list not empty");

    AssertMsg(!this->opHelperBlockIter.IsValid(), "Got to the end with a helper block still on the list?");

    Assert(this->currentBlock->inlineeStack.Count() == 0);
    this->InsertOpHelperSpillAndRestores();

#if _M_IX86
# if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.Instrument.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(),this->func->GetLocalFunctionId()))
    {
        this->DynamicStatsInstrument();
    }
# endif
#endif

#if DBG_DUMP
    if (PHASE_STATS(Js::LinearScanPhase, this->func))
    {
        this->PrintStats();
    }
    if (PHASE_TRACE(Js::StackPackPhase, this->func))
    {
        Output::Print(_u("---------------------------\n"));
    }
#endif // DBG_DUMP
    DebugOnly(this->func->allowRemoveBailOutArgInstr = true);
}